

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O2

void __thiscall
duckdb::BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan>::Insert
          (BinaryAggregateHeap<long,_duckdb::string_t,_duckdb::GreaterThan> *this,
          ArenaAllocator *allocator,long *key,string_t *value)

{
  ulong uVar1;
  idx_t iVar2;
  pair<duckdb::HeapEntry<long>,_duckdb::HeapEntry<duckdb::string_t>_> *ppVar3;
  STORAGE_TYPE *pSVar4;
  
  ppVar3 = this->heap;
  uVar1 = this->size;
  if (uVar1 < this->capacity) {
    ppVar3[uVar1].first.value = *key;
    HeapEntry<duckdb::string_t>::Assign(&ppVar3[uVar1].second,allocator,value);
    pSVar4 = this->heap;
    iVar2 = this->size + 1;
    this->size = iVar2;
    ppVar3 = pSVar4 + iVar2;
  }
  else {
    if (*key <= (ppVar3->first).value) {
      return;
    }
    ::std::
    pop_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>
              (ppVar3,ppVar3 + uVar1,Compare);
    iVar2 = this->size;
    pSVar4 = this->heap;
    pSVar4[iVar2 - 1].first.value = *key;
    HeapEntry<duckdb::string_t>::Assign(&pSVar4[iVar2 - 1].second,allocator,value);
    pSVar4 = this->heap;
    ppVar3 = pSVar4 + this->size;
  }
  ::std::
  push_heap<std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>*,bool(*)(std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&,std::pair<duckdb::HeapEntry<long>,duckdb::HeapEntry<duckdb::string_t>>const&)>
            (pSVar4,ppVar3,Compare);
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const K &key, const V &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size].first.Assign(allocator, key);
			heap[size].second.Assign(allocator, value);
			size++;
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (K_COMPARATOR::Operation(key, heap[0].first.value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].first.Assign(allocator, key);
			heap[size - 1].second.Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}